

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_system.cpp
# Opt level: O1

int main(int argc,char **argv,char **env)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  runtime_error *prVar6;
  char cVar7;
  char **ppcVar8;
  bool bVar9;
  string command;
  string key;
  string example;
  string value;
  wstring wexample;
  ostringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  long *local_248 [2];
  long local_238 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string local_208 [32];
  long *local_1e8 [2];
  long local_1d8 [2];
  long *local_1c8 [2];
  long local_1b8 [2];
  ostringstream local_1a8 [376];
  
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,anon_var_dwarf_4026,anon_var_dwarf_4026 + 8);
  local_1c8[0] = local_1b8;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)local_1c8,L"ש-м-ν",L"");
  if (argc == 2) {
    if (*argv[1] != '-') {
      iVar1 = std::__cxx11::string::compare((char *)&local_228);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error argv[1]==example in ",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_268);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (argv[2] != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error argv[2] == 0 in ",0x16);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1a);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_268);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar2 = getenv("NOWIDE_TEST");
      if (pcVar2 == (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::getenv(\"NOWIDE_TEST\") in ",0x27);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1b);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_268);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pcVar2 = getenv("NOWIDE_TEST_NONE");
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::getenv(\"NOWIDE_TEST_NONE\") == 0 in ",0x31);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_268);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = std::__cxx11::string::compare((char *)&local_228);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::getenv(\"NOWIDE_TEST\")==example in ",0x30);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x1d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_268);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::operator+(&local_268,"NOWIDE_TEST=",&local_228);
      pcVar2 = *env;
      if (pcVar2 == (char *)0x0) {
LAB_00102b07:
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error found in ",0xf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_248[0] = (long *)CONCAT71(local_248[0]._1_7_,0x3a);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_248,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x2c);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)local_248);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      ppcVar8 = env + 1;
      bVar9 = false;
      do {
        pcVar3 = strchr(pcVar2,0x3d);
        if (pcVar3 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error key_end in ",0x11);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                     ,100);
          local_248[0] = (long *)CONCAT71(local_248[0]._1_7_,0x3a);
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_248,1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x24);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,(string *)local_248);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        local_248[0] = local_238;
        std::__cxx11::string::_M_construct<char*>((string *)local_248,pcVar2,pcVar3);
        local_1e8[0] = local_1d8;
        sVar4 = strlen(pcVar3 + 1);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,pcVar3 + 1,pcVar3 + sVar4 + 1);
        pcVar2 = getenv((char *)local_248[0]);
        if (pcVar2 == (char *)0x0) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error nowide::getenv(key.c_str()) in ",0x25);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                     ,100);
          local_208[0] = (string)0x3a;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_208,1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x27);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,local_208);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar1 = std::__cxx11::string::compare((char *)local_1e8);
        if (iVar1 != 0) {
          std::__cxx11::ostringstream::ostringstream(local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Error nowide::getenv(key.c_str()) == value in ",0x2e);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                     ,100);
          local_208[0] = (string)0x3a;
          poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(char *)local_208,1);
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x28);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
          prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar6,local_208);
          __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar1 = std::__cxx11::string::compare((char *)&local_268);
        if (iVar1 == 0) {
          bVar9 = true;
        }
        if (local_1e8[0] != local_1d8) {
          operator_delete(local_1e8[0],local_1d8[0] + 1);
        }
        if (local_248[0] != local_238) {
          operator_delete(local_248[0],local_238[0] + 1);
        }
        pcVar2 = *ppcVar8;
        ppcVar8 = ppcVar8 + 1;
      } while (pcVar2 != (char *)0x0);
      if (!bVar9) goto LAB_00102b07;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Subprocess ok",0xd);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) goto LAB_001026db;
LAB_001026e8:
      iVar1 = 0;
      goto LAB_001026ea;
    }
    if (*argv[1] != '-') goto LAB_001024a0;
    cVar7 = argv[1][1];
    if (cVar7 == 'n') {
      iVar1 = setenv("NOWIDE_TEST",local_228._M_dataplus._M_p,1);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Error nowide::setenv(\"NOWIDE_TEST\",example.c_str(),1) == 0 in ",0x3e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x41);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_268);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = setenv("NOWIDE_TEST_NONE",local_228._M_dataplus._M_p,1);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "Error nowide::setenv(\"NOWIDE_TEST_NONE\",example.c_str(),1) == 0 in ",0x43);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x42);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_268);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      iVar1 = unsetenv("NOWIDE_TEST_NONE");
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::unsetenv(\"NOWIDE_TEST_NONE\") == 0 in ",0x33
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_268._M_dataplus._M_p._0_1_ = 0x3a;
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)&local_268,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x43);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)&local_268);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"\"","");
      std::__cxx11::string::append((char *)&local_268);
      std::__cxx11::string::append((char *)&local_268);
      std::__cxx11::string::_M_append((char *)&local_268,(ulong)local_228._M_dataplus._M_p);
      iVar1 = system(local_268._M_dataplus._M_p);
      if (iVar1 != 0) {
        std::__cxx11::ostringstream::ostringstream(local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Error nowide::system(command.c_str()) == 0 in ",0x2e);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/halex2005[P]boost-nowide/test/test_system.cpp"
                   ,100);
        local_248[0] = (long *)CONCAT71(local_248[0]._1_7_,0x3a);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(char *)local_248,1);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x4d);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"main",4);
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(prVar6,(string *)local_248);
        __cxa_throw(prVar6,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parent ok",9);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._M_dataplus._M_p != &local_268.field_2) {
LAB_001026db:
        operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001026e8;
    }
    if (cVar7 == 'w') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Wide API is irrelevant",0x16);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      iVar1 = 0;
      std::ostream::flush();
      goto LAB_001026ea;
    }
    cVar7 = -0x28;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Invalid parameters expected \'-n/-w\'",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  }
  else {
LAB_001024a0:
    cVar7 = 'p';
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid parameters",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'p');
  }
  std::ostream::put(cVar7);
  iVar1 = 1;
  std::ostream::flush();
LAB_001026ea:
  if (local_1c8[0] != local_1b8) {
    operator_delete(local_1c8[0],local_1b8[0] * 4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  return iVar1;
}

Assistant:

int main(int argc,char **argv,char **env)
{
    try {
        std::string example = "\xd7\xa9-\xd0\xbc-\xce\xbd";
        std::wstring wexample = L"\u05e9-\u043c-\u03bd";
        nowide::args a(argc,argv,env);
        if(argc==2 && argv[1][0]!='-') {
            TEST(argv[1]==example);
            TEST(argv[2] == 0);
            TEST(nowide::getenv("NOWIDE_TEST"));
            TEST(nowide::getenv("NOWIDE_TEST_NONE") == 0);
            TEST(nowide::getenv("NOWIDE_TEST")==example);
            std::string sample = "NOWIDE_TEST=" + example;
            bool found = false;
            for(char **e=env;*e!=0;e++) {
				char *eptr = *e;
				//printf("%s\n",eptr);
                char *key_end = strchr(eptr,'=');
                TEST(key_end);
                std::string key = std::string(eptr,key_end);
                std::string value = key_end + 1;
		        TEST(nowide::getenv(key.c_str()));
                TEST(nowide::getenv(key.c_str()) == value);
                if(*e == sample)
                    found = true;
            }
            TEST(found);
            std::cout << "Subprocess ok" << std::endl;
        }
        else if(argc==2 && argv[1][0]=='-') {
            switch(argv[1][1]) {
            case 'w': 
                {
                    #ifdef NOWIDE_WINDOWS
                    std::wstring env = L"NOWIDE_TEST=" + wexample;
                    _wputenv(env.c_str());
                    std::wstring wcommand = nowide::widen(argv[0]);
                    wcommand += L" ";
                    wcommand += wexample;
                    TEST(_wsystem(wcommand.c_str()) == 0);
                    std::cout << "Wide Parent ok" << std::endl;
                    #else
                    std::cout << "Wide API is irrelevant" << std::endl;
                    #endif
                }
                return 0;
            case 'n':
                TEST(nowide::setenv("NOWIDE_TEST",example.c_str(),1) == 0);
                TEST(nowide::setenv("NOWIDE_TEST_NONE",example.c_str(),1) == 0);
                TEST(nowide::unsetenv("NOWIDE_TEST_NONE") == 0);
                break;
            default:
                std::cout << "Invalid parameters expected '-n/-w'" << std::endl;
                return 1;
            }
            std::string command = "\"";
            command += argv[0];
            command += "\" ";
            command += example;
            TEST(nowide::system(command.c_str()) == 0);
            std::cout << "Parent ok" << std::endl;
        }
        else {
            std::cerr << "Invalid parameters" << std::endl;
            return 1;
        }
        return 0;
    }
    catch(std::exception const &e) {
        std::cerr << "Failed " << e.what() << std::endl;
        return 1;
    }
}